

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCV.cpp
# Opt level: O0

Variable * __thiscall TCV::getAvailableVar(TCV *this,string *nodeName)

{
  bool bVar1;
  ulong uVar2;
  mapped_type *ppCVar3;
  Function *pFVar4;
  mapped_type _class;
  Variable *variable;
  string *nodeName_local;
  TCV *this_local;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    ppCVar3 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>_>
              ::at(&this->symbolTable->classes,&this->currentNamespace);
    pFVar4 = Class::getFunction(*ppCVar3,&this->currentFuncName,this->currentFunction);
    _class = (mapped_type)Function::getVariable(pFVar4,nodeName);
  }
  else {
    bVar1 = std::operator==(&this->currentFuncName,"main");
    if (bVar1) {
      _class = (mapped_type)Function::getVariable(this->symbolTable->main,nodeName);
    }
    else {
      pFVar4 = Semantic::SymbolTable::getFreeFunction
                         (this->symbolTable,&this->currentFuncName,this->currentFunction);
      _class = (mapped_type)Function::getVariable(pFVar4,nodeName);
    }
  }
  return (Variable *)_class;
}

Assistant:

const Variable *TCV::getAvailableVar(std::string &nodeName) const {
    const Variable *variable;
    if (currentNamespace.empty()) {
        if (currentFuncName == "main")
            variable = symbolTable->main->getVariable(nodeName);
        else
            variable = symbolTable->getFreeFunction(currentFuncName, currentFunction)->getVariable(nodeName);
    } else {
        auto _class = symbolTable->classes.at(currentNamespace);
        variable = _class->getFunction(currentFuncName, currentFunction)->getVariable(nodeName);
    }
    return variable;
}